

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTDMT_releaseBuffer(ZSTDMT_bufferPool *bufPool,buffer_t buf)

{
  uint uVar1;
  ZSTD_customMem customMem;
  undefined8 *puVar2;
  undefined8 in_RDX;
  void *in_RSI;
  pthread_mutex_t *in_RDI;
  undefined8 in_stack_ffffffffffffffe0;
  
  if (in_RSI != (void *)0x0) {
    pthread_mutex_lock(in_RDI);
    if (*(uint *)((long)in_RDI + 0x34) < *(uint *)((long)in_RDI + 0x30)) {
      uVar1 = *(uint *)((long)in_RDI + 0x34);
      *(uint *)((long)in_RDI + 0x34) = uVar1 + 1;
      puVar2 = (undefined8 *)((long)in_RDI + (ulong)uVar1 * 0x10 + 0x50);
      *puVar2 = in_RSI;
      puVar2[1] = in_RDX;
      pthread_mutex_unlock(in_RDI);
    }
    else {
      pthread_mutex_unlock(in_RDI);
      customMem.customFree = (ZSTD_freeFunction)in_RDI;
      customMem.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffe0;
      customMem.opaque = in_RSI;
      ZSTD_customFree(*(void **)((long)in_RDI + 0x40),customMem);
    }
  }
  return;
}

Assistant:

static void ZSTDMT_releaseBuffer(ZSTDMT_bufferPool* bufPool, buffer_t buf)
{
    DEBUGLOG(5, "ZSTDMT_releaseBuffer");
    if (buf.start == NULL) return;   /* compatible with release on NULL */
    ZSTD_pthread_mutex_lock(&bufPool->poolMutex);
    if (bufPool->nbBuffers < bufPool->totalBuffers) {
        bufPool->bTable[bufPool->nbBuffers++] = buf;  /* stored for later use */
        DEBUGLOG(5, "ZSTDMT_releaseBuffer: stored buffer of size %u in slot %u",
                    (U32)buf.capacity, (U32)(bufPool->nbBuffers-1));
        ZSTD_pthread_mutex_unlock(&bufPool->poolMutex);
        return;
    }
    ZSTD_pthread_mutex_unlock(&bufPool->poolMutex);
    /* Reached bufferPool capacity (should not happen) */
    DEBUGLOG(5, "ZSTDMT_releaseBuffer: pool capacity reached => freeing ");
    ZSTD_customFree(buf.start, bufPool->cMem);
}